

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O3

PackedStructFieldDef * __thiscall
kratos::PortPackedStruct::get_definition(PortPackedStruct *this,string *name)

{
  element_type *peVar1;
  PackedStructFieldDef *pPVar2;
  pointer __s1;
  size_t __n;
  int iVar3;
  PackedStructFieldDef *def;
  PackedStructFieldDef *pPVar4;
  
  peVar1 = (this->struct_).super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pPVar4 = (peVar1->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (peVar1->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar4 != pPVar2) {
    __s1 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    do {
      if (__n == (pPVar4->name)._M_string_length) {
        if (__n == 0) {
          return pPVar4;
        }
        iVar3 = bcmp(__s1,(pPVar4->name)._M_dataplus._M_p,__n);
        if (iVar3 == 0) {
          return pPVar4;
        }
      }
      pPVar4 = pPVar4 + 1;
    } while (pPVar4 != pPVar2);
  }
  return (PackedStructFieldDef *)0x0;
}

Assistant:

const PackedStructFieldDef* PortPackedStruct::get_definition(const std::string& name) const {
    for (auto const& def : struct_->attributes) {
        if (name == def.name) {
            return &def;
        }
    }
    return nullptr;
}